

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

int cargo_fprint_usage(cargo_t ctx,FILE *f,cargo_usage_t flags)

{
  char *pcVar1;
  int iVar2;
  
  if (ctx != (cargo_t)0x0) {
    pcVar1 = cargo_get_usage(ctx,flags);
    if (pcVar1 == (char *)0x0) {
      iVar2 = -1;
    }
    else {
      iVar2 = 0;
      fprintf((FILE *)f,"%s\n",pcVar1);
    }
    return iVar2;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x16bc,"int cargo_fprint_usage(cargo_t, FILE *, cargo_usage_t)");
}

Assistant:

int cargo_fprint_usage(cargo_t ctx, FILE *f, cargo_usage_t flags)
{
    const char *s;
    assert(ctx);

    if (!(s = cargo_get_usage(ctx, flags)))
    {
        return -1;
    }

    fprintf(f, "%s\n", s);

    return 0;
}